

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDie::dump(DWARFDie *this,raw_ostream *OS,uint Indent,DIDumpOptions DumpOpts)

{
  Form Form;
  char *pcVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  DIDumpOptions DumpOpts_00;
  undefined1 auVar4 [16];
  DIDumpOptions DumpOpts_01;
  pointer ppfVar5;
  uint64_t uVar6;
  DWARFAbbreviationDeclaration *pDVar7;
  DWARFAbbreviationDeclaration *pDVar8;
  raw_ostream *prVar9;
  WithColor *Params;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  uint Indent_00;
  DWARFDie Die;
  StringRef Str;
  StringRef Str_00;
  StringRef Fmt;
  undefined1 local_118 [8];
  DWARFDataExtractor debug_info_data;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_> local_e0;
  WithColor local_90;
  raw_ostream *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined2 local_68;
  undefined4 uStack_66;
  undefined2 uStack_62;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48;
  undefined1 uStack_47;
  undefined4 uStack_46;
  undefined2 uStack_42;
  pointer local_40;
  uint64_t offset;
  
  if ((this->U != (DWARFUnit *)0x0) && (this->Die != (DWARFDebugInfoEntry *)0x0)) {
    DWARFUnit::getDebugInfoExtractor((DWARFDataExtractor *)local_118,this->U);
    ppfVar5 = (pointer)getOffset(this);
    uVar3 = DumpOpts._18_4_;
    uVar2 = DumpOpts._8_8_;
    local_40 = ppfVar5;
    if (DumpOpts.ShowParents == true) {
      if (this->Die == (DWARFDebugInfoEntry *)0x0 || this->U == (DWARFUnit *)0x0) {
        Die = (DWARFDie)ZEXT816(0);
      }
      else {
        Die = DWARFUnit::getParent(this->U,this->Die);
      }
      local_78 = DumpOpts._0_8_;
      local_68 = 0;
      uStack_62 = DumpOpts._22_2_;
      lVar11 = (ulong)DumpOpts._18_6_ << 0x10;
      auVar4 = DumpOpts._0_16_;
      DumpOpts_00.ShowChildren = (bool)(char)lVar11;
      DumpOpts_00.ShowParents = (bool)(char)((ulong)lVar11 >> 8);
      DumpOpts_00.ShowForm = (bool)(char)((ulong)lVar11 >> 0x10);
      DumpOpts_00.SummarizeTypes = (bool)(char)((ulong)lVar11 >> 0x18);
      DumpOpts_00.Verbose = (bool)(char)((ulong)lVar11 >> 0x20);
      DumpOpts_00.DisplayRawContents = (bool)(char)((ulong)lVar11 >> 0x28);
      DumpOpts_00._22_2_ = (short)((ulong)lVar11 >> 0x30);
      DumpOpts_00.DumpType = auVar4._0_4_;
      DumpOpts_00.ChildRecurseDepth = auVar4._4_4_;
      DumpOpts_00.ParentRecurseDepth = auVar4._8_4_;
      DumpOpts_00.Version = auVar4._12_2_;
      DumpOpts_00.AddrSize = auVar4[0xe];
      DumpOpts_00.ShowAddresses = (bool)auVar4[0xf];
      uStack_70 = uVar2;
      uStack_66 = uVar3;
      Indent = dumpParentChain(Die,OS,Indent,DumpOpts_00,0);
    }
    if (local_40 < debug_info_data.super_DataExtractor.Data.Data) {
      uVar6 = DataExtractor::getULEB128
                        ((DataExtractor *)local_118,(uint64_t *)&local_40,(Error *)0x0);
      if (DumpOpts.ShowAddresses == true) {
        offset = uVar6;
        WithColor::WithColor(&local_90,OS,Address,false);
        local_e0.super_formatv_object_base.Fmt.Length = (size_t)"\n0x%8.8lx: ";
        local_e0.super_formatv_object_base.Fmt.Data = (char *)&PTR_home_01097f70;
        local_e0.super_formatv_object_base.Adapters.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start = ppfVar5;
        raw_ostream::operator<<(local_90.OS,(format_object_base *)&local_e0);
        WithColor::~WithColor(&local_90);
        uVar6 = offset;
      }
      if ((int)uVar6 == 0) {
        prVar9 = raw_ostream::indent(OS,Indent);
        Str.Length = 5;
        Str.Data = "NULL\n";
        raw_ostream::operator<<(prVar9,Str);
      }
      else {
        pDVar7 = getAbbreviationDeclarationPtr(this);
        if (pDVar7 == (DWARFAbbreviationDeclaration *)0x0) {
          Str_00.Length = 0x3e;
          Str_00.Data = "Abbreviation code not found in \'debug_abbrev\' class for code: ";
          prVar9 = raw_ostream::operator<<(OS,Str_00);
          prVar9 = raw_ostream::operator<<(prVar9,uVar6 & 0xffffffff);
          pcVar1 = prVar9->OutBufCur;
          if (pcVar1 < prVar9->OutBufEnd) {
            prVar9->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(prVar9,10,__buf,(size_t)pcVar1);
          }
        }
        else {
          offset = uVar6;
          WithColor::WithColor((WithColor *)&debug_info_data.Section,OS,Tag,false);
          local_80 = raw_ostream::indent((raw_ostream *)debug_info_data.Section,Indent);
          pDVar8 = getAbbreviationDeclarationPtr(this);
          if (pDVar8 == (DWARFAbbreviationDeclaration *)0x0) {
            local_90._8_2_ = DW_TAG_null;
          }
          else {
            local_90._8_2_ = pDVar8->Tag;
          }
          Params = &local_90;
          local_90.OS = (raw_ostream *)&PTR_anchor_01097d20;
          Fmt.Length = 3;
          Fmt.Data = "{0}";
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>::
          formatv_object(&local_e0,Fmt,
                         (tuple<llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_> *)Params);
          raw_ostream::operator<<(local_80,&local_e0.super_formatv_object_base);
          if (local_e0.super_formatv_object_base.Replacements.
              super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_e0.super_formatv_object_base.Replacements.
                                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_e0.super_formatv_object_base.Replacements.
                                  super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0.super_formatv_object_base.Adapters.
              super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_e0.super_formatv_object_base.Adapters.
                                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_e0.super_formatv_object_base.Adapters.
                                  super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          WithColor::~WithColor((WithColor *)&debug_info_data.Section);
          pvVar10 = extraout_RDX;
          if (DumpOpts.Verbose == true) {
            Params = (WithColor *)0x20;
            if (pDVar7->HasChildren != false) {
              Params = (WithColor *)0x2a;
            }
            local_e0.super_formatv_object_base.Fmt.Length = (size_t)" [%u] %c";
            local_e0.super_formatv_object_base.Fmt.Data = (char *)&PTR_home_01098788;
            local_e0.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT71(local_e0.super_formatv_object_base.Adapters.
                                   super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,(char)Params);
            local_e0.super_formatv_object_base.Adapters.
            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44((int)offset,
                                   local_e0.super_formatv_object_base.Adapters.
                                   super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_4_);
            raw_ostream::operator<<(OS,(format_object_base *)&local_e0);
            pvVar10 = extraout_RDX_00;
          }
          offset = CONCAT44(offset._4_4_,Indent);
          pcVar1 = OS->OutBufCur;
          if (pcVar1 < OS->OutBufEnd) {
            OS->OutBufCur = pcVar1 + 1;
            *pcVar1 = '\n';
          }
          else {
            raw_ostream::write(OS,10,pvVar10,(size_t)Params);
          }
          uVar12 = (ulong)(pDVar7->AttributeSpecs).
                          super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                          super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                          .
                          super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                          .super_SmallVectorBase.Size;
          if (uVar12 != 0) {
            pvVar10 = (pDVar7->AttributeSpecs).
                      super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                      super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                      .
                      super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                      .super_SmallVectorBase.BeginX;
            lVar11 = 0;
            do {
              Form = *(Form *)((long)pvVar10 + lVar11 + 2);
              if (Form != DW_FORM_implicit_const) {
                dumpAttribute(OS,this,(uint64_t *)&local_40,*(Attribute *)((long)pvVar10 + lVar11),
                              Form,(uint)offset,DumpOpts);
              }
              lVar11 = lVar11 + 0x10;
            } while (uVar12 << 4 != lVar11);
          }
          if (this->Die == (DWARFDebugInfoEntry *)0x0 || this->U == (DWARFUnit *)0x0) {
            local_e0.super_formatv_object_base.Fmt = (StringRef)ZEXT816(0);
          }
          else {
            local_e0.super_formatv_object_base.Fmt =
                 (StringRef)DWARFUnit::getFirstChild(this->U,this->Die);
          }
          if (((((DumpOpts.ShowChildren & DumpOpts.ChildRecurseDepth != 0) != 0) &&
               ((DWARFDebugInfoEntry *)local_e0.super_formatv_object_base.Fmt.Length !=
                (DWARFDebugInfoEntry *)0x0 &&
                (DWARFUnit *)local_e0.super_formatv_object_base.Fmt.Data != (DWARFUnit *)0x0)) &&
              ((DWARFUnit *)local_e0.super_formatv_object_base.Fmt.Data != (DWARFUnit *)0x0)) &&
             ((DWARFDebugInfoEntry *)local_e0.super_formatv_object_base.Fmt.Length !=
              (DWARFDebugInfoEntry *)0x0)) {
            Indent_00 = (uint)offset + 2;
            do {
              local_48 = DumpOpts.ShowChildren;
              local_58 = CONCAT44(DumpOpts.ChildRecurseDepth - 1,DumpOpts.DumpType);
              uStack_47 = 0;
              uStack_42 = DumpOpts._22_2_;
              DumpOpts_01.ShowParents = false;
              DumpOpts_01.ShowChildren = DumpOpts.ShowChildren;
              DumpOpts_01.ShowForm = (bool)(char)uVar3;
              DumpOpts_01.SummarizeTypes = (bool)(char)((uint)uVar3 >> 8);
              DumpOpts_01.Verbose = (bool)(char)((uint)uVar3 >> 0x10);
              DumpOpts_01.DisplayRawContents = (bool)(char)((uint)uVar3 >> 0x18);
              DumpOpts_01._22_2_ = DumpOpts._22_2_;
              DumpOpts_01.ParentRecurseDepth = (int)uVar2;
              DumpOpts_01.Version = (short)((ulong)uVar2 >> 0x20);
              DumpOpts_01.AddrSize = (char)((ulong)uVar2 >> 0x30);
              DumpOpts_01.ShowAddresses = (bool)(char)((ulong)uVar2 >> 0x38);
              DumpOpts_01.DumpType = DumpOpts.DumpType;
              DumpOpts_01.ChildRecurseDepth = DumpOpts.ChildRecurseDepth - 1;
              uStack_50 = uVar2;
              uStack_46 = uVar3;
              dump((DWARFDie *)&local_e0,OS,Indent_00,DumpOpts_01);
              if ((DWARFDebugInfoEntry *)local_e0.super_formatv_object_base.Fmt.Length ==
                  (DWARFDebugInfoEntry *)0x0 ||
                  (DWARFUnit *)local_e0.super_formatv_object_base.Fmt.Data == (DWARFUnit *)0x0) {
                local_e0.super_formatv_object_base.Fmt = (StringRef)ZEXT816(0);
              }
              else {
                local_e0.super_formatv_object_base.Fmt =
                     (StringRef)
                     DWARFUnit::getSibling
                               ((DWARFUnit *)local_e0.super_formatv_object_base.Fmt.Data,
                                (DWARFDebugInfoEntry *)local_e0.super_formatv_object_base.Fmt.Length
                               );
              }
            } while (((DWARFUnit *)local_e0.super_formatv_object_base.Fmt.Data != (DWARFUnit *)0x0)
                    && ((DWARFDebugInfoEntry *)local_e0.super_formatv_object_base.Fmt.Length !=
                        (DWARFDebugInfoEntry *)0x0));
          }
        }
      }
    }
  }
  return;
}

Assistant:

void DWARFDie::dump(raw_ostream &OS, unsigned Indent,
                    DIDumpOptions DumpOpts) const {
  if (!isValid())
    return;
  DWARFDataExtractor debug_info_data = U->getDebugInfoExtractor();
  const uint64_t Offset = getOffset();
  uint64_t offset = Offset;
  if (DumpOpts.ShowParents) {
    DIDumpOptions ParentDumpOpts = DumpOpts;
    ParentDumpOpts.ShowParents = false;
    ParentDumpOpts.ShowChildren = false;
    Indent = dumpParentChain(getParent(), OS, Indent, ParentDumpOpts);
  }

  if (debug_info_data.isValidOffset(offset)) {
    uint32_t abbrCode = debug_info_data.getULEB128(&offset);
    if (DumpOpts.ShowAddresses)
      WithColor(OS, HighlightColor::Address).get()
          << format("\n0x%8.8" PRIx64 ": ", Offset);

    if (abbrCode) {
      auto AbbrevDecl = getAbbreviationDeclarationPtr();
      if (AbbrevDecl) {
        WithColor(OS, HighlightColor::Tag).get().indent(Indent)
            << formatv("{0}", getTag());
        if (DumpOpts.Verbose)
          OS << format(" [%u] %c", abbrCode,
                       AbbrevDecl->hasChildren() ? '*' : ' ');
        OS << '\n';

        // Dump all data in the DIE for the attributes.
        for (const auto &AttrSpec : AbbrevDecl->attributes()) {
          if (AttrSpec.Form == DW_FORM_implicit_const) {
            // We are dumping .debug_info section ,
            // implicit_const attribute values are not really stored here,
            // but in .debug_abbrev section. So we just skip such attrs.
            continue;
          }
          dumpAttribute(OS, *this, &offset, AttrSpec.Attr, AttrSpec.Form,
                        Indent, DumpOpts);
        }

        DWARFDie child = getFirstChild();
        if (DumpOpts.ShowChildren && DumpOpts.ChildRecurseDepth > 0 && child) {
          DumpOpts.ChildRecurseDepth--;
          DIDumpOptions ChildDumpOpts = DumpOpts;
          ChildDumpOpts.ShowParents = false;
          while (child) {
            child.dump(OS, Indent + 2, ChildDumpOpts);
            child = child.getSibling();
          }
        }
      } else {
        OS << "Abbreviation code not found in 'debug_abbrev' class for code: "
           << abbrCode << '\n';
      }
    } else {
      OS.indent(Indent) << "NULL\n";
    }
  }
}